

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O0

void __thiscall
server_context::send_partial_response
          (server_context *this,server_slot *slot,completion_token_output *tkn)

{
  int iVar1;
  initializer_list<int> __l;
  pointer psVar2;
  string *psVar3;
  server_slot *this_00;
  server_response *this_01;
  size_t __n;
  unique_ptr<server_task_result_cmpl_partial,_std::default_delete<server_task_result_cmpl_partial>_>
  *in_RDX;
  void *__buf;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  __single_object res;
  completion_token_output *in_stack_ffffffffffffff08;
  completion_token_output *in_stack_ffffffffffffff10;
  unique_ptr<server_task_result_cmpl_partial,_std::default_delete<server_task_result_cmpl_partial>_>
  *this_02;
  unique_ptr<server_task_result_cmpl_partial,_std::default_delete<server_task_result_cmpl_partial>_>
  *in_stack_ffffffffffffff18;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff28;
  int32_t iVar4;
  undefined4 in_stack_ffffffffffffff2c;
  undefined2 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff32;
  byte bVar5;
  undefined1 in_stack_ffffffffffffff33;
  undefined4 in_stack_ffffffffffffff34;
  oaicompat_type oVar6;
  unique_ptr<server_task_result_cmpl_partial,_std::default_delete<server_task_result_cmpl_partial>_>
  local_98;
  undefined1 local_90 [76];
  undefined4 local_44;
  undefined4 *local_40;
  undefined8 local_38;
  unique_ptr<server_task_result_cmpl_partial,_std::default_delete<server_task_result_cmpl_partial>_>
  *local_18;
  long local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  httplib::detail::std::make_unique<server_task_result_cmpl_partial>();
  iVar1 = *(int *)(local_10 + 4);
  psVar2 = httplib::detail::std::
           unique_ptr<server_task_result_cmpl_partial,_std::default_delete<server_task_result_cmpl_partial>_>
           ::operator->((unique_ptr<server_task_result_cmpl_partial,_std::default_delete<server_task_result_cmpl_partial>_>
                         *)0x2bf227);
  (psVar2->super_server_task_result).id = iVar1;
  iVar1 = *(int *)(local_10 + 0x78);
  psVar2 = httplib::detail::std::
           unique_ptr<server_task_result_cmpl_partial,_std::default_delete<server_task_result_cmpl_partial>_>
           ::operator->((unique_ptr<server_task_result_cmpl_partial,_std::default_delete<server_task_result_cmpl_partial>_>
                         *)0x2bf247);
  psVar2->index = iVar1;
  psVar3 = (string *)(local_18 + 1);
  psVar2 = httplib::detail::std::
           unique_ptr<server_task_result_cmpl_partial,_std::default_delete<server_task_result_cmpl_partial>_>
           ::operator->((unique_ptr<server_task_result_cmpl_partial,_std::default_delete<server_task_result_cmpl_partial>_>
                         *)0x2bf269);
  std::__cxx11::string::operator=((string *)&psVar2->content,psVar3);
  local_44 = *(undefined4 *)
              &(local_18->_M_t).
               super___uniq_ptr_impl<server_task_result_cmpl_partial,_std::default_delete<server_task_result_cmpl_partial>_>
               ._M_t.
               super__Tuple_impl<0UL,_server_task_result_cmpl_partial_*,_std::default_delete<server_task_result_cmpl_partial>_>
               .super__Head_base<0UL,_server_task_result_cmpl_partial_*,_false>._M_head_impl;
  local_40 = &local_44;
  local_38 = 1;
  httplib::detail::std::
  unique_ptr<server_task_result_cmpl_partial,_std::default_delete<server_task_result_cmpl_partial>_>
  ::operator->((unique_ptr<server_task_result_cmpl_partial,_std::default_delete<server_task_result_cmpl_partial>_>
                *)0x2bf2b6);
  __l._M_array._4_4_ = in_stack_ffffffffffffff2c;
  __l._M_array._0_4_ = in_stack_ffffffffffffff28;
  __l._M_len._0_2_ = in_stack_ffffffffffffff30;
  __l._M_len._2_1_ = in_stack_ffffffffffffff32;
  __l._M_len._3_1_ = in_stack_ffffffffffffff33;
  __l._M_len._4_4_ = in_stack_ffffffffffffff34;
  httplib::detail::std::vector<int,_std::allocator<int>_>::operator=(in_stack_ffffffffffffff20,__l);
  iVar4 = *(int32_t *)(local_10 + 0x758);
  psVar2 = httplib::detail::std::
           unique_ptr<server_task_result_cmpl_partial,_std::default_delete<server_task_result_cmpl_partial>_>
           ::operator->((unique_ptr<server_task_result_cmpl_partial,_std::default_delete<server_task_result_cmpl_partial>_>
                         *)0x2bf2f8);
  psVar2->n_decoded = iVar4;
  iVar4 = *(int32_t *)(local_10 + 0x768);
  psVar2 = httplib::detail::std::
           unique_ptr<server_task_result_cmpl_partial,_std::default_delete<server_task_result_cmpl_partial>_>
           ::operator->((unique_ptr<server_task_result_cmpl_partial,_std::default_delete<server_task_result_cmpl_partial>_>
                         *)0x2bf31b);
  psVar2->n_prompt_tokens = iVar4;
  bVar5 = *(byte *)(local_10 + 0xf1);
  psVar2 = httplib::detail::std::
           unique_ptr<server_task_result_cmpl_partial,_std::default_delete<server_task_result_cmpl_partial>_>
           ::operator->((unique_ptr<server_task_result_cmpl_partial,_std::default_delete<server_task_result_cmpl_partial>_>
                         *)0x2bf33e);
  psVar2->post_sampling_probs = (bool)(bVar5 & 1);
  bVar5 = *(byte *)(local_10 + 0x6f0);
  psVar2 = httplib::detail::std::
           unique_ptr<server_task_result_cmpl_partial,_std::default_delete<server_task_result_cmpl_partial>_>
           ::operator->((unique_ptr<server_task_result_cmpl_partial,_std::default_delete<server_task_result_cmpl_partial>_>
                         *)0x2bf364);
  psVar2->verbose = (bool)(bVar5 & 1);
  oVar6 = *(oaicompat_type *)(local_10 + 0x6f4);
  psVar2 = httplib::detail::std::
           unique_ptr<server_task_result_cmpl_partial,_std::default_delete<server_task_result_cmpl_partial>_>
           ::operator->((unique_ptr<server_task_result_cmpl_partial,_std::default_delete<server_task_result_cmpl_partial>_>
                         *)0x2bf38d);
  __n = (size_t)oVar6;
  psVar2->oaicompat = oVar6;
  psVar3 = (string *)(local_10 + 0x6f8);
  psVar2 = httplib::detail::std::
           unique_ptr<server_task_result_cmpl_partial,_std::default_delete<server_task_result_cmpl_partial>_>
           ::operator->((unique_ptr<server_task_result_cmpl_partial,_std::default_delete<server_task_result_cmpl_partial>_>
                         *)0x2bf3b4);
  std::__cxx11::string::operator=((string *)&psVar2->oaicompat_model,psVar3);
  this_00 = (server_slot *)(local_10 + 0x718);
  psVar2 = httplib::detail::std::
           unique_ptr<server_task_result_cmpl_partial,_std::default_delete<server_task_result_cmpl_partial>_>
           ::operator->((unique_ptr<server_task_result_cmpl_partial,_std::default_delete<server_task_result_cmpl_partial>_>
                         *)0x2bf3ea);
  std::__cxx11::string::operator=((string *)&psVar2->oaicompat_cmpl_id,(string *)this_00);
  if (0 < *(int *)(local_10 + 0x100)) {
    httplib::detail::std::
    unique_ptr<server_task_result_cmpl_partial,_std::default_delete<server_task_result_cmpl_partial>_>
    ::operator->((unique_ptr<server_task_result_cmpl_partial,_std::default_delete<server_task_result_cmpl_partial>_>
                  *)0x2bf42b);
    completion_token_output::operator=(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    in_stack_ffffffffffffff18 = local_18;
  }
  if ((*(int *)(local_10 + 0x7fc) != 0) || ((*(byte *)(local_10 + 0xf0) & 1) != 0)) {
    server_slot::get_timings(this_00);
    psVar2 = httplib::detail::std::
             unique_ptr<server_task_result_cmpl_partial,_std::default_delete<server_task_result_cmpl_partial>_>
             ::operator->((unique_ptr<server_task_result_cmpl_partial,_std::default_delete<server_task_result_cmpl_partial>_>
                           *)0x2bf49a);
    memcpy(&psVar2->timings,local_90,0x48);
  }
  this_01 = (server_response *)(in_RDI + 0x15d8);
  this_02 = &local_98;
  std::unique_ptr<server_task_result,std::default_delete<server_task_result>>::
  unique_ptr<server_task_result_cmpl_partial,std::default_delete<server_task_result_cmpl_partial>,void>
            ((unique_ptr<server_task_result,_std::default_delete<server_task_result>_> *)this_00,
             in_stack_ffffffffffffff18);
  server_response::send(this_01,(int)this_02,__buf,__n,in_R8D);
  httplib::detail::std::unique_ptr<server_task_result,_std::default_delete<server_task_result>_>::
  ~unique_ptr((unique_ptr<server_task_result,_std::default_delete<server_task_result>_> *)this_00);
  httplib::detail::std::
  unique_ptr<server_task_result_cmpl_partial,_std::default_delete<server_task_result_cmpl_partial>_>
  ::~unique_ptr(this_02);
  return;
}

Assistant:

void send_partial_response(server_slot & slot, const completion_token_output & tkn) {
        auto res = std::make_unique<server_task_result_cmpl_partial>();

        res->id      = slot.id_task;
        res->index   = slot.index;
        res->content = tkn.text_to_send;
        res->tokens  = { tkn.tok };

        res->n_decoded           = slot.n_decoded;
        res->n_prompt_tokens     = slot.n_prompt_tokens;
        res->post_sampling_probs = slot.params.post_sampling_probs;

        res->verbose           = slot.params.verbose;
        res->oaicompat         = slot.params.oaicompat;
        res->oaicompat_model   = slot.params.oaicompat_model;
        res->oaicompat_cmpl_id = slot.params.oaicompat_cmpl_id;

        // populate res.probs_output
        if (slot.params.sampling.n_probs > 0) {
            res->prob_output = tkn; // copy the token probs
        }

        // populate timings if this is final response or timings_per_token is enabled
        if (slot.stop != STOP_TYPE_NONE || slot.params.timings_per_token) {
            res->timings = slot.get_timings();
        }

        queue_results.send(std::move(res));
    }